

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O1

void __thiscall
PartsBupOutputter::setBase(PartsBupOutputter *this,path *basePath,Image *img,string *name)

{
  path *__lhs;
  pointer pcVar1;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var2;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  path local_80;
  path local_58;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_80,name,auto_format);
  std::filesystem::__cxx11::operator/(&local_58,basePath,&local_80);
  __lhs = &this->partsPath;
  if (&local_58 != __lhs) {
    setBase();
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  std::filesystem::create_directory(__lhs);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_c0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_80,&local_c0,auto_format);
  std::filesystem::__cxx11::operator/(&local_58,__lhs,&local_80);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  Image::writePNG(img,&local_58,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (&this->basePath != basePath) {
    std::__cxx11::string::operator=((string *)&this->basePath,(string *)basePath);
    _Var2._M_head_impl =
         (basePath->_M_cmpts)._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    (basePath->_M_cmpts)._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (_Impl *)0x0;
    _Var3._M_head_impl =
         (this->basePath)._M_cmpts._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    (this->basePath)._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         _Var2._M_head_impl;
    if (_Var3._M_head_impl != (_Impl *)0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&(this->basePath)._M_cmpts,_Var3._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear(basePath);
  }
  std::__cxx11::string::operator=((string *)&this->baseName,(string *)name);
  (this->base).size = img->size;
  std::vector<Color,_std::allocator<Color>_>::_M_move_assign
            (&(this->base).colorData,&img->colorData);
  return;
}

Assistant:

void setBase(fs::path basePath, Image img, std::string name) override {
		partsPath = basePath/name;
		fs::create_directory(partsPath);
		img.writePNG(partsPath/fs::u8path(name + ".png"));
		this->basePath = std::move(basePath);
		baseName = std::move(name);
		base = std::move(img);
	}